

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::GetImageTypeInfo
               (ValidationState_t *_,uint32_t id,ImageTypeInfo *info)

{
  Op OVar1;
  uint32_t uVar2;
  Dim DVar3;
  ImageFormat IVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar5;
  AccessQualifier local_44;
  size_t num_words;
  Instruction *inst;
  ImageTypeInfo *info_local;
  uint32_t id_local;
  ValidationState_t *__local;
  
  if ((id == 0) || (info == (ImageTypeInfo *)0x0)) {
    __local._7_1_ = false;
  }
  else {
    num_words = (size_t)ValidationState_t::FindDef(_,id);
    if ((Instruction *)num_words == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,100,
                    "bool spvtools::val::(anonymous namespace)::GetImageTypeInfo(const ValidationState_t &, uint32_t, ImageTypeInfo *)"
                   );
    }
    OVar1 = val::Instruction::opcode((Instruction *)num_words);
    if (OVar1 == OpTypeSampledImage) {
      uVar2 = val::Instruction::word((Instruction *)num_words,2);
      num_words = (size_t)ValidationState_t::FindDef(_,uVar2);
      if ((Instruction *)num_words == (Instruction *)0x0) {
        __assert_fail("inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                      ,0x68,
                      "bool spvtools::val::(anonymous namespace)::GetImageTypeInfo(const ValidationState_t &, uint32_t, ImageTypeInfo *)"
                     );
      }
    }
    OVar1 = val::Instruction::opcode((Instruction *)num_words);
    if (OVar1 == OpTypeImage) {
      this = val::Instruction::words((Instruction *)num_words);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
      if ((sVar5 == 9) || (sVar5 == 10)) {
        uVar2 = val::Instruction::word((Instruction *)num_words,2);
        info->sampled_type = uVar2;
        DVar3 = val::Instruction::word((Instruction *)num_words,3);
        info->dim = DVar3;
        uVar2 = val::Instruction::word((Instruction *)num_words,4);
        info->depth = uVar2;
        uVar2 = val::Instruction::word((Instruction *)num_words,5);
        info->arrayed = uVar2;
        uVar2 = val::Instruction::word((Instruction *)num_words,6);
        info->multisampled = uVar2;
        uVar2 = val::Instruction::word((Instruction *)num_words,7);
        info->sampled = uVar2;
        IVar4 = val::Instruction::word((Instruction *)num_words,8);
        info->format = IVar4;
        if (sVar5 < 10) {
          local_44 = AccessQualifierMax;
        }
        else {
          local_44 = val::Instruction::word((Instruction *)num_words,9);
        }
        info->access_qualifier = local_44;
        __local._7_1_ = true;
      }
      else {
        __local._7_1_ = false;
      }
    }
    else {
      __local._7_1_ = false;
    }
  }
  return __local._7_1_;
}

Assistant:

bool GetImageTypeInfo(const ValidationState_t& _, uint32_t id,
                      ImageTypeInfo* info) {
  if (!id || !info) return false;

  const Instruction* inst = _.FindDef(id);
  assert(inst);

  if (inst->opcode() == spv::Op::OpTypeSampledImage) {
    inst = _.FindDef(inst->word(2));
    assert(inst);
  }

  if (inst->opcode() != spv::Op::OpTypeImage) return false;

  const size_t num_words = inst->words().size();
  if (num_words != 9 && num_words != 10) return false;

  info->sampled_type = inst->word(2);
  info->dim = static_cast<spv::Dim>(inst->word(3));
  info->depth = inst->word(4);
  info->arrayed = inst->word(5);
  info->multisampled = inst->word(6);
  info->sampled = inst->word(7);
  info->format = static_cast<spv::ImageFormat>(inst->word(8));
  info->access_qualifier =
      num_words < 10 ? spv::AccessQualifier::Max
                     : static_cast<spv::AccessQualifier>(inst->word(9));
  return true;
}